

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatCleanMark0(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  if (iVar1 != 0) {
    Gia_ManIncrementTravId(p);
    pObj_00 = Gia_ObjFanin0(pObj);
    Cec_ManPatComputePattern4_rec(p,pObj_00);
    return;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                ,0x157,"void Cec_ManPatCleanMark0(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatCleanMark0( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    Gia_ManIncrementTravId( p );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin0(pObj) );
}